

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O0

void EBML_CRCAddBuffer(ebml_crc *CRC,void *Buf,size_t Size)

{
  byte *local_30;
  uint8_t *Buf8;
  uint32_t *Buf32;
  size_t Size_local;
  void *Buf_local;
  ebml_crc *CRC_local;
  
  Buf8 = (uint8_t *)Buf;
  for (Buf32 = (uint32_t *)Size; (uint32_t *)0x3 < Buf32; Buf32 = Buf32 + -1) {
    CRC->CRC = *(uint *)Buf8 ^ CRC->CRC;
    CRC->CRC = m_tab[CRC->CRC & 0xff] ^ CRC->CRC >> 8;
    CRC->CRC = m_tab[CRC->CRC & 0xff] ^ CRC->CRC >> 8;
    CRC->CRC = m_tab[CRC->CRC & 0xff] ^ CRC->CRC >> 8;
    CRC->CRC = m_tab[CRC->CRC & 0xff] ^ CRC->CRC >> 8;
    Buf8 = Buf8 + 4;
  }
  local_30 = Buf8;
  while (Buf32 != (uint32_t *)0x0) {
    CRC->CRC = m_tab[CRC->CRC & 0xff ^ (uint)*local_30] ^ CRC->CRC >> 8;
    local_30 = local_30 + 1;
    Buf32 = (uint32_t *)((long)Buf32 + -1);
  }
  return;
}

Assistant:

void EBML_CRCAddBuffer(ebml_crc *CRC, const void *Buf, size_t Size)
{
	const uint32_t *Buf32 = Buf;
	while (Size >= 4)
	{
		CRC->CRC ^= *Buf32;
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		Size -= 4;
		Buf32++;
	}

	const uint8_t *Buf8 = (const uint8_t *)Buf32;
	while (Size--)
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC) ^ *Buf8++] ^ CRC32_SHIFTED(CRC->CRC);
}